

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::DisplayGraph(cmComputeTargetDepends *this,Graph *graph,string *name)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  pointer pcVar5;
  
  fprintf(_stderr,"The %s target dependency graph is:\n",(name->_M_dataplus)._M_p);
  uVar2 = ((long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
  }
  for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    pcVar1 = (graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    fprintf(_stderr,"target %d is [%s]\n",uVar2 & 0xffffffff,
            ((this->Targets).super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2]->Name)._M_dataplus._M_p);
    for (pcVar5 = *(pointer *)
                   &pcVar1[uVar2].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar5 != *(pointer *)
                   ((long)&pcVar1[uVar2].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                           super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
        pcVar5 = pcVar5 + 1) {
      pcVar4 = "weak";
      if (pcVar5->Strong != false) {
        pcVar4 = "strong";
      }
      fprintf(_stderr,"  depends on target %d [%s] (%s)\n",(long)pcVar5->Dest,
              ((this->Targets).
               super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
               super__Vector_impl_data._M_start[pcVar5->Dest]->Name)._M_dataplus._M_p,pcVar4);
    }
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void
cmComputeTargetDepends::DisplayGraph(Graph const& graph,
                                     const std::string& name)
{
  fprintf(stderr, "The %s target dependency graph is:\n", name.c_str());
  int n = static_cast<int>(graph.size());
  for(int depender_index = 0; depender_index < n; ++depender_index)
    {
    EdgeList const& nl = graph[depender_index];
    cmTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %d is [%s]\n",
            depender_index, depender->GetName().c_str());
    for(EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
      {
      int dependee_index = *ni;
      cmTarget const* dependee = this->Targets[dependee_index];
      fprintf(stderr, "  depends on target %d [%s] (%s)\n", dependee_index,
              dependee->GetName().c_str(), ni->IsStrong()? "strong" : "weak");
      }
    }
  fprintf(stderr, "\n");
}